

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * tinyusdz::print_animatable_timesamples<tinyusdz::value::texcoord2f>
                   (string *__return_storage_ptr__,Animatable<tinyusdz::value::texcoord2f> *v,
                   uint32_t indent)

{
  bool bVar1;
  TypedTimeSamples<tinyusdz::value::texcoord2f> *v_00;
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream aoStack_198 [380];
  uint32_t local_1c;
  Animatable<tinyusdz::value::texcoord2f> *pAStack_18;
  uint32_t indent_local;
  Animatable<tinyusdz::value::texcoord2f> *v_local;
  
  local_1c = indent;
  pAStack_18 = v;
  v_local = (Animatable<tinyusdz::value::texcoord2f> *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  bVar1 = Animatable<tinyusdz::value::texcoord2f>::has_timesamples(pAStack_18);
  if (bVar1) {
    v_00 = Animatable<tinyusdz::value::texcoord2f>::get_timesamples(pAStack_18);
    print_typed_timesamples<tinyusdz::value::texcoord2f>(&local_1c8,v_00,local_1c);
    std::operator<<(aoStack_198,(string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string print_animatable_timesamples(const Animatable<T> &v,
                             const uint32_t indent = 0) {
  std::stringstream ss;

  if (v.has_timesamples()) {
    ss << print_typed_timesamples(v.get_timesamples(), indent);
  }

  return ss.str();
}